

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

void us_internal_ssl_socket_shutdown(us_internal_ssl_socket_t *s)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  us_socket_context_t *context_00;
  us_loop_t *s_00;
  us_socket_t *in_RDI;
  int err;
  int ret;
  loop_ssl_data *loop_ssl_data;
  us_loop_t *loop;
  us_internal_ssl_socket_context_t *context;
  int local_24;
  us_internal_ssl_socket_t *in_stack_ffffffffffffffe0;
  
  iVar2 = us_socket_is_closed(0,in_RDI);
  if ((iVar2 == 0) &&
     (iVar2 = us_internal_ssl_socket_is_shut_down(in_stack_ffffffffffffffe0), iVar2 == 0)) {
    context_00 = us_socket_context(0,in_RDI);
    s_00 = us_socket_context_loop(0,context_00);
    iVar2 = (int)((ulong)context_00 >> 0x20);
    pvVar1 = (s_00->data).ssl_data;
    *(undefined4 *)((long)pvVar1 + 0x10) = 0;
    *(us_socket_t **)((long)pvVar1 + 0x18) = in_RDI;
    *(undefined4 *)((long)pvVar1 + 0x24) = 0;
    local_24 = SSL_shutdown(*(SSL **)&in_RDI[1].p);
    if (local_24 == 0) {
      local_24 = SSL_shutdown(*(SSL **)&in_RDI[1].p);
    }
    if (local_24 < 0) {
      iVar3 = SSL_get_error(*(SSL **)&in_RDI[1].p,local_24);
      if ((iVar3 == 1) || (iVar3 == 5)) {
        ERR_clear_error();
      }
      us_socket_shutdown(iVar2,(us_socket_t *)s_00);
    }
  }
  return;
}

Assistant:

void us_internal_ssl_socket_shutdown(struct us_internal_ssl_socket_t *s) {
    if (!us_socket_is_closed(0, &s->s) && !us_internal_ssl_socket_is_shut_down(s)) {
        struct us_internal_ssl_socket_context_t *context = (struct us_internal_ssl_socket_context_t *) us_socket_context(0, &s->s);
        struct us_loop_t *loop = us_socket_context_loop(0, &context->sc);
        struct loop_ssl_data *loop_ssl_data = (struct loop_ssl_data *) loop->data.ssl_data;

        // also makes no sense to touch this here!
        // however the idea is that if THIS socket is not the same as ssl_socket then this data is not for me
        // but this is not correct as it is currently anyways, any data available should be properly reset
        loop_ssl_data->ssl_read_input_length = 0;


        // essentially we need two of these: one for CURRENT CALL and one for CURRENT SOCKET WITH DATA
        // if those match in the BIO function then you may read, if not then you may not read
        // we need ssl_read_socket to be set in on_data and checked in the BIO
        loop_ssl_data->ssl_socket = &s->s;


        loop_ssl_data->msg_more = 0;

        // sets SSL_SENT_SHUTDOWN no matter what (not actually true if error!)
        int ret = SSL_shutdown(s->ssl);
        if (ret == 0) {
            ret = SSL_shutdown(s->ssl);
        }

        if (ret < 0) {

            int err = SSL_get_error(s->ssl, ret);
            if (err == SSL_ERROR_SSL || err == SSL_ERROR_SYSCALL) {
                // clear
                ERR_clear_error();
            }

            // we get here if we are shutting down while still in init
            us_socket_shutdown(0, &s->s);
        }
    }
}